

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall asmjit::String::_opVFormat(String *this,uint32_t op,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  Error EVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  va_list apCopy;
  char buf [1024];
  
  uVar4 = (ulong)(this->field_0)._type;
  uVar6 = uVar4;
  if (0x1e < uVar4) {
    uVar6 = (this->field_0)._large.size;
  }
  sVar7 = 0x1e;
  if (0x1e < uVar4) {
    sVar7 = (this->field_0)._large.capacity;
  }
  uVar4 = 0;
  if (op != 0) {
    uVar4 = uVar6;
  }
  uVar6 = sVar7 - uVar4;
  apCopy[0].reg_save_area = ap->reg_save_area;
  apCopy[0].gp_offset = ap->gp_offset;
  apCopy[0].fp_offset = ap->fp_offset;
  apCopy[0].overflow_arg_area = ap->overflow_arg_area;
  if (uVar6 < 0x80) {
    uVar1 = vsnprintf(buf,0x400,fmt,ap);
    sVar7 = (size_t)(int)uVar1;
    if (uVar1 < 0x400) {
      EVar3 = _opString(this,op,buf,sVar7);
      return EVar3;
    }
  }
  else {
    if ((this->field_0)._type < 0x1f) {
      pcVar5 = (this->field_0)._small.data;
    }
    else {
      pcVar5 = (this->field_0)._large.data;
    }
    uVar1 = vsnprintf(pcVar5 + uVar4,uVar6,fmt,ap);
    sVar7 = (size_t)(int)uVar1;
    if (sVar7 <= uVar6) {
      if ((this->field_0)._type < 0x1f) {
        (this->field_0)._type = (uint8_t)(uVar4 + sVar7);
      }
      else {
        (this->field_0)._large.size = uVar4 + sVar7;
      }
      return 0;
    }
  }
  if ((int)uVar1 < 0) {
    EVar3 = 3;
  }
  else {
    pcVar5 = prepare(this,op,sVar7);
    if (pcVar5 == (char *)0x0) {
      EVar3 = 1;
    }
    else {
      iVar2 = vsnprintf(pcVar5,sVar7 + 1,fmt,apCopy);
      EVar3 = 0;
      if (sVar7 != (long)iVar2) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/string.cpp"
                   ,0x1b6,"size_t(fmtResult) == outputSize");
      }
    }
  }
  return EVar3;
}

Assistant:

Error String::_opVFormat(uint32_t op, const char* fmt, va_list ap) noexcept {
  size_t startAt = (op == kOpAssign) ? size_t(0) : size();
  size_t remainingCapacity = capacity() - startAt;

  char buf[1024];
  int fmtResult;
  size_t outputSize;

  va_list apCopy;
  va_copy(apCopy, ap);

  if (remainingCapacity >= 128) {
    fmtResult = vsnprintf(data() + startAt, remainingCapacity, fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize <= remainingCapacity)) {
      _setSize(startAt + outputSize);
      return kErrorOk;
    }
  }
  else {
    fmtResult = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize < ASMJIT_ARRAY_SIZE(buf)))
      return _opString(op, buf, outputSize);
  }

  if (ASMJIT_UNLIKELY(fmtResult < 0))
    return DebugUtils::errored(kErrorInvalidState);

  char* p = prepare(op, outputSize);
  if (ASMJIT_UNLIKELY(!p))
    return DebugUtils::errored(kErrorOutOfMemory);

  fmtResult = vsnprintf(p, outputSize + 1, fmt, apCopy);
  ASMJIT_ASSERT(size_t(fmtResult) == outputSize);

  return kErrorOk;
}